

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O3

void __thiscall
vkt::shaderexecutor::anon_unknown_0::BufferIoExecutor::readOutputBuffer
          (BufferIoExecutor *this,void **outputPtrs,int numValues)

{
  DataType dataType;
  Allocation *pAVar1;
  void *pvVar2;
  void *pvVar3;
  int iVar4;
  uint uVar5;
  VkDevice device;
  DeviceInterface *vkd;
  pointer pSVar6;
  InternalError *this_00;
  int iVar7;
  deUint32 dVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  pointer pVVar13;
  bool bVar14;
  bool bVar15;
  int local_94;
  string local_50;
  
  device = Context::getDevice((this->super_ShaderExecutor).m_context);
  vkd = Context::getDeviceInterface((this->super_ShaderExecutor).m_context);
  pVVar13 = (this->m_outputLayout).
            super__Vector_base<vkt::shaderexecutor::(anonymous_namespace)::BufferIoExecutor::VarLayout,_std::allocator<vkt::shaderexecutor::(anonymous_namespace)::BufferIoExecutor::VarLayout>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar13 ==
      (this->m_outputLayout).
      super__Vector_base<vkt::shaderexecutor::(anonymous_namespace)::BufferIoExecutor::VarLayout,_std::allocator<vkt::shaderexecutor::(anonymous_namespace)::BufferIoExecutor::VarLayout>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    dVar8 = 0;
  }
  else {
    dVar8 = pVVar13->stride;
  }
  pAVar1 = (this->m_outputAlloc).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (vkd,device,(VkDeviceMemory)(pAVar1->m_memory).m_internal,pAVar1->m_offset,
             (long)(int)(dVar8 * numValues));
  pSVar6 = (this->super_ShaderExecutor).m_shaderSpec.outputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->super_ShaderExecutor).m_shaderSpec.outputs.
      super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>.
      _M_impl.super__Vector_impl_data._M_finish != pSVar6) {
    uVar9 = 0;
    do {
      if (pSVar6[uVar9].varType.m_type != TYPE_BASIC) {
        this_00 = (InternalError *)__cxa_allocate_exception(0x38);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Unsupported type","");
        tcu::InternalError::InternalError(this_00,&local_50);
        __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
      }
      pVVar13 = (this->m_outputLayout).
                super__Vector_base<vkt::shaderexecutor::(anonymous_namespace)::BufferIoExecutor::VarLayout,_std::allocator<vkt::shaderexecutor::(anonymous_namespace)::BufferIoExecutor::VarLayout>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar9;
      pvVar2 = ((this->m_outputAlloc).
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_hostPtr;
      pvVar3 = outputPtrs[uVar9];
      dataType = pSVar6[uVar9].varType.m_data.basic.type;
      bVar14 = dataType - TYPE_FLOAT_MAT2 < 9;
      bVar15 = dataType - TYPE_DOUBLE_MAT2 < 9;
      iVar4 = glu::getDataTypeScalarSize(dataType);
      uVar5 = 1;
      if (bVar15 || bVar14) {
        uVar5 = glu::getDataTypeMatrixNumColumns(dataType);
      }
      if (0 < numValues) {
        local_94 = 0;
        iVar10 = 0;
        do {
          if (0 < (int)uVar5) {
            uVar12 = 0;
            iVar11 = local_94;
            do {
              iVar7 = pVVar13->matrixStride * (int)uVar12;
              if (!bVar15 && !bVar14) {
                iVar7 = 0;
              }
              memcpy((void *)((long)pvVar3 + (long)iVar11),
                     (void *)((long)(int)(iVar7 + pVVar13->stride * iVar10 + pVVar13->offset) +
                             (long)pvVar2),(long)(iVar4 / (int)uVar5) * 4);
              uVar12 = uVar12 + 1;
              iVar11 = iVar11 + (iVar4 / (int)uVar5) * 4;
            } while (uVar5 != uVar12);
          }
          iVar10 = iVar10 + 1;
          local_94 = local_94 + iVar4 * 4;
        } while (iVar10 != numValues);
      }
      uVar9 = uVar9 + 1;
      pSVar6 = (this->super_ShaderExecutor).m_shaderSpec.outputs.
               super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)(((long)(this->super_ShaderExecutor).m_shaderSpec.outputs.
                                    super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar6 >> 3)
                            * 0x6db6db6db6db6db7));
  }
  return;
}

Assistant:

void BufferIoExecutor::readOutputBuffer (void* const* outputPtrs, int numValues)
{
	const VkDevice			vkDevice			= m_context.getDevice();
	const DeviceInterface&	vk					= m_context.getDeviceInterface();

	const deUint32			outputStride		= getLayoutStride(m_outputLayout);
	const int				outputBufferSize	= numValues * outputStride;

	DE_ASSERT(outputBufferSize > 0); // At least some outputs are required.

	invalidateMappedMemoryRange(vk, vkDevice, m_outputAlloc->getMemory(), m_outputAlloc->getOffset(), outputBufferSize);

	DE_ASSERT(m_shaderSpec.outputs.size() == m_outputLayout.size());
	for (size_t outputNdx = 0; outputNdx < m_shaderSpec.outputs.size(); ++outputNdx)
	{
		const glu::VarType&		varType		= m_shaderSpec.outputs[outputNdx].varType;
		const VarLayout&		layout		= m_outputLayout[outputNdx];

		copyFromBuffer(varType, layout, numValues, m_outputAlloc->getHostPtr(), outputPtrs[outputNdx]);
	}
}